

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O2

int dic_find(dictionary *dic,void *key,int keyn)

{
  uint32_t uVar1;
  int iVar2;
  keynode *pkVar3;
  
  uVar1 = meiyan((char *)key,keyn);
  pkVar3 = dic->table[(int)(uVar1 % (uint)dic->length)];
  if (pkVar3 != (keynode *)0x0) {
    for (; pkVar3 != (keynode *)0x0; pkVar3 = pkVar3->next) {
      if (((uint)pkVar3->len == keyn) &&
         (iVar2 = bcmp(pkVar3->key,key,(ulong)(uint)keyn), iVar2 == 0)) {
        dic->value = &pkVar3->value;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int dic_find(struct dictionary* dic, void *key, int keyn) {
	int n = hash_func((const char*)key, keyn) % dic->length;
	__builtin_prefetch(dic->table[n]);
	struct keynode *k = dic->table[n];
	if (!k) return 0;
	while (k) {
		if (k->len == keyn && !memcmp(k->key, key, keyn)) {
			dic->value = &k->value;
			return 1;
		}
		k = k->next;
	}
	return 0;
}